

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O1

void * crnlib::crnlib_realloc(void *p,size_t size,size_t *pActual_size,bool movable)

{
  void *pvVar1;
  char *pExp;
  size_t actual_size;
  size_t local_10;
  
  if (((ulong)p & 0xf) == 0) {
    if (size < 0x400000001) {
      local_10 = 4;
      if (2 < size - 1) {
        local_10 = size;
      }
      pvVar1 = (void *)(*(code *)g_pRealloc)(p,local_10,&local_10,movable,g_pUser_data);
      if (pActual_size == (size_t *)0x0) {
        return pvVar1;
      }
      *pActual_size = local_10;
      return pvVar1;
    }
    pExp = "crnlib_malloc: size too big";
  }
  else {
    pExp = "crnlib_realloc: bad ptr";
  }
  crnlib_assert(pExp,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_mem.cpp"
                ,0xaa);
  return (void *)0x0;
}

Assistant:

void* crnlib_realloc(void* p, size_t size, size_t* pActual_size, bool movable)
    {
        if ((ptr_bits_t)p & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnlib_mem_error("crnlib_realloc: bad ptr");
            return nullptr;
        }

        if (size > CRNLIB_MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnlib_mem_error("crnlib_malloc: size too big");
            return nullptr;
        }

#if CRNLIB_MEM_STATS
        size_t cur_size = p ? (*g_pMSize)(p, g_pUser_data) : 0;
        CRNLIB_ASSERT(!p || (cur_size >= sizeof(uint32)));
#endif
        if ((size) && (size < sizeof(uint32)))
        {
            size = sizeof(uint32);
        }

        size_t actual_size = size;
        void* p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);

        if (pActual_size)
        {
            *pActual_size = actual_size;
        }

        CRNLIB_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if CRNLIB_MEM_STATS
        CRNLIB_ASSERT(!p_new || ((*g_pMSize)(p_new, g_pUser_data) == actual_size));

        int num_new_blocks = 0;
        if (p)
        {
            if (!p_new)
                num_new_blocks = -1;
        }
        else if (p_new)
        {
            num_new_blocks = 1;
        }
        update_total_allocated(num_new_blocks, static_cast<mem_stat_t>(actual_size) - static_cast<mem_stat_t>(cur_size));
#endif

        return p_new;
    }